

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

TabularCPT * __thiscall
despot::Parser::CreateTabularStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  pointer pSVar1;
  NamedVar *child;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  bool condition;
  int iVar6;
  int iVar7;
  TiXmlElement *pTVar8;
  char *pcVar9;
  long *plVar10;
  TiXmlNode *pTVar11;
  mapped_type *ppVVar12;
  undefined7 extraout_var;
  TabularCPT *this_00;
  TiXmlElement *pTVar13;
  pointer pbVar14;
  size_type *psVar15;
  pointer pTVar16;
  pointer pbVar17;
  pointer pNVar18;
  pointer pSVar19;
  ulong uVar20;
  Parser *this_01;
  long lVar21;
  long lVar22;
  uint uVar23;
  string parent_name;
  vector<double,_std::allocator<double>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [40];
  Parser *local_290;
  vector<double,_std::allocator<double>_> local_288;
  TabularCPT *local_270;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  undefined1 local_250 [40];
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_228;
  undefined1 local_210 [32];
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  pointer local_1b0;
  undefined1 local_1a8 [16];
  pointer ppCStack_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  string local_f8;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_d8;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_d0;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_c8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_c0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_268 = (pointer)e_CondProb;
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&e_CondProb->super_TiXmlNode,"Var");
  pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,pcVar9,(allocator<char> *)local_2b8);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  local_d0 = &this->curr_state_vars_;
  bVar4 = Variable::IsVariableName(&local_88,local_d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 "In <StateTransitionFunction>: Var ",&local_68);
  plVar10 = (long *)std::__cxx11::string::append(local_2b8);
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_f8.field_2._M_allocated_capacity = *psVar15;
    local_f8.field_2._8_8_ = plVar10[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar15;
    local_f8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_f8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pTVar11 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)local_268,"Var");
  Ensure(this,bVar4,&local_f8,&pTVar11->super_TiXmlBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_270 = (TabularCPT *)&this->variables_;
  ppVVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                           *)local_270,&local_68);
  child = (NamedVar *)*ppVVar12;
  local_228.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement((TiXmlNode *)local_268,"Parent");
  pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,pcVar9,(allocator<char> *)local_2d8);
  local_2d8._0_8_ = (TiXmlElement *)(local_2d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8," ","");
  Tokenize(&local_110,(string *)local_2b8,(string *)local_2d8);
  if ((TiXmlElement *)local_2d8._0_8_ != (TiXmlElement *)(local_2d8 + 0x10)) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_290 = this;
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c8 = &local_290->prev_state_vars_;
    local_d8 = &local_290->action_vars_;
    lVar21 = 8;
    uVar20 = 0;
    do {
      local_2b8._0_8_ = local_2b8 + 0x10;
      lVar22 = *(long *)((long)local_110.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b8,lVar22,
                 *(long *)((long)&((local_110.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar21) + lVar22);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_2b8._0_8_,(pointer)(local_2b8._0_8_ + local_2b8._8_8_));
      bVar4 = Variable::IsVariableName(&local_130,local_c8);
      condition = true;
      if (bVar4) {
LAB_0014f25d:
        local_2b8._32_8_ = local_2b8._32_8_ & 0xffffffff00000000;
      }
      else {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_2b8._0_8_,(pointer)(local_2b8._0_8_ + local_2b8._8_8_)
                  );
        bVar5 = Variable::IsVariableName(&local_150,local_d0);
        if (bVar5) goto LAB_0014f25d;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_2b8._0_8_,(pointer)(local_2b8._0_8_ + local_2b8._8_8_)
                  );
        condition = Variable::IsVariableName(&local_170,local_d8);
        local_2b8._32_4_ = (int)CONCAT71(extraout_var,1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     "In <StateTransitionFunction>: Parent ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      plVar10 = (long *)std::__cxx11::string::append(local_2d8);
      local_1d0._0_8_ = local_1d0 + 0x10;
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar15) {
        local_1c0._M_allocated_capacity = *psVar15;
        local_1c0._8_8_ = plVar10[3];
      }
      else {
        local_1c0._M_allocated_capacity = *psVar15;
        local_1d0._0_8_ = (size_type *)*plVar10;
      }
      local_1d0._8_8_ = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pTVar11 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)local_268,"Parent");
      Ensure(local_290,condition,(string *)local_1d0,&pTVar11->super_TiXmlBase);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
      }
      if ((TiXmlElement *)local_2d8._0_8_ != (TiXmlElement *)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
      }
      if ((local_2b8[0x20] != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2)) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2)) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      ppVVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                               *)local_270,(key_type *)local_2b8);
      local_2d8._0_8_ = *ppVVar12;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_228,
                 (NamedVar **)local_2d8);
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      uVar20 = uVar20 + 1;
      lVar21 = lVar21 + 0x20;
    } while (uVar20 < (ulong)((long)local_110.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_110.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this_00 = (TabularCPT *)operator_new(0x70);
  local_270 = this_00;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_c0,&local_228)
  ;
  TabularCPT::TabularCPT(this_00,child,&local_c0);
  if ((_Elt_pointer)
      local_c0.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar8 = GetParameterElement(local_290,(TiXmlElement *)local_268);
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Entry");
  do {
    if (pTVar8 == (TiXmlElement *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110);
      if ((pointer)local_228.
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return this_00;
    }
    pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Instance");
    pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b8,pcVar9,(allocator<char> *)local_2d8);
    local_2d8._0_8_ = (TiXmlElement *)(local_2d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8," ","");
    Tokenize(&local_48,(string *)local_2b8,(string *)local_2d8);
    if ((TiXmlElement *)local_2d8._0_8_ != (TiXmlElement *)(local_2d8 + 0x10)) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
    }
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"ProbTable");
    pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar13);
    this_01 = (Parser *)local_2b8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b8,pcVar9,(allocator<char> *)local_2d8);
    iVar6 = ComputeNumOfEntries(this_01,&local_48,&local_228,child);
    iVar7 = std::__cxx11::string::compare((char *)local_2b8);
    if (iVar7 == 0) {
      if (0 < iVar6) {
        local_2b8._32_8_ =
             1.0 / (double)(int)((ulong)((long)(child->super_Variable).values_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(child->super_Variable).values_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
        do {
          local_2d8._0_8_ = local_2b8._32_8_;
          if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_288,
                       (iterator)
                       local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)local_2d8);
          }
          else {
            *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = (double)local_2b8._32_8_;
            local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)local_2b8);
      if (iVar7 == 0) {
        pbVar14 = (child->super_Variable).values_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar17 = (child->super_Variable).values_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (0 < (int)((ulong)((long)pbVar17 - (long)pbVar14) >> 5)) {
          iVar6 = 0;
          do {
            iVar7 = (int)((ulong)((long)pbVar17 - (long)pbVar14) >> 5);
            if (0 < iVar7) {
              iVar7 = 0;
              do {
                uVar23 = 0x3ff00000;
                if (iVar6 != iVar7) {
                  uVar23 = 0;
                }
                local_2d8._0_8_ = (ulong)uVar23 << 0x20;
                if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&local_288,
                             (iterator)
                             local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)local_2d8);
                  pbVar14 = (child->super_Variable).values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar17 = (child->super_Variable).values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = (double)((ulong)uVar23 << 0x20);
                  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                iVar7 = iVar7 + 1;
              } while (iVar7 < (int)((ulong)((long)pbVar17 - (long)pbVar14) >> 5));
              iVar7 = (int)((ulong)((long)pbVar17 - (long)pbVar14) >> 5);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < iVar7);
        }
      }
      else {
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8," ","");
        Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_250 + 0x10),(string *)local_2b8,(string *)local_2d8);
        local_2b8._32_8_ = pTVar8;
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        lVar21 = local_250._24_8_ - local_250._16_8_;
        to_string<int>(&local_a8,iVar6);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x17602b);
        pTVar16 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pTVar16) {
          local_1a8._8_8_ = (pTVar16->super_CPT).super_Function._vptr_Function;
          ppCStack_198 = (pointer)plVar10[3];
          local_1b0 = (pointer)(local_1a8 + 8);
        }
        else {
          local_1a8._8_8_ = (pTVar16->super_CPT).super_Function._vptr_Function;
          local_1b0 = (pointer)*plVar10;
        }
        local_1a8._0_8_ = plVar10[1];
        *plVar10 = (long)pTVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1b0);
        local_260 = (pointer)local_250;
        pSVar19 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pSVar19) {
          local_250._0_8_ = (pSVar19->super_NamedVar).super_Variable._vptr_Variable;
          local_250._8_8_ = plVar10[3];
        }
        else {
          local_250._0_8_ = (pSVar19->super_NamedVar).super_Variable._vptr_Variable;
          local_260 = (pointer)*plVar10;
        }
        local_258 = (pointer)plVar10[1];
        *plVar10 = (long)pSVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        to_string<unsigned_long>
                  ((string *)local_210,(long)(local_250._24_8_ - local_250._16_8_) >> 5);
        pSVar19 = (pointer)0xf;
        if (local_260 != (pointer)local_250) {
          pSVar19 = (pointer)local_250._0_8_;
        }
        pSVar1 = (pointer)((long)&((Variable *)local_210._8_8_)->_vptr_Variable + (long)local_258);
        if (pSVar19 < pSVar1) {
          pSVar19 = (pointer)0xf;
          if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
            pSVar19 = (pointer)local_210._16_8_;
          }
          if (pSVar19 < pSVar1) goto LAB_0014f8e7;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_210,0,(char *)0x0,(ulong)local_260);
        }
        else {
LAB_0014f8e7:
          plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_260,local_210._0_8_);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        pTVar8 = (TiXmlElement *)(plVar10 + 2);
        if ((TiXmlElement *)*plVar10 == pTVar8) {
          local_2d8._16_8_ = (pTVar8->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase;
          local_2d8._24_8_ = plVar10[3];
        }
        else {
          local_2d8._16_8_ = (pTVar8->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase;
          local_2d8._0_8_ = (TiXmlElement *)*plVar10;
        }
        local_2d8._8_8_ = plVar10[1];
        *plVar10 = (long)pTVar8;
        plVar10[1] = 0;
        *(undefined1 *)&(pTVar8->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = 0;
        plVar10 = (long *)std::__cxx11::string::append(local_2d8);
        local_1f0._0_8_ = local_1f0 + 0x10;
        pNVar18 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pNVar18) {
          local_1e0._M_allocated_capacity = (size_type)(pNVar18->super_Variable)._vptr_Variable;
          local_1e0._8_8_ = plVar10[3];
        }
        else {
          local_1e0._M_allocated_capacity = (size_type)(pNVar18->super_Variable)._vptr_Variable;
          local_1f0._0_8_ = (pointer)*plVar10;
        }
        local_1f0._8_8_ = plVar10[1];
        *plVar10 = (long)pNVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement
                           ((TiXmlNode *)local_2b8._32_8_,"ProbTable");
        Ensure(local_290,lVar21 >> 5 == (long)iVar6,(string *)local_1f0,(TiXmlBase *)pTVar8);
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._M_allocated_capacity + 1));
        }
        if ((TiXmlElement *)local_2d8._0_8_ != (TiXmlElement *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
        }
        if (local_260 != (pointer)local_250) {
          operator_delete(local_260,
                          (ulong)((long)&(((NamedVar *)local_250._0_8_)->super_Variable).
                                         _vptr_Variable + 1));
        }
        if (local_1b0 != (pointer)(local_1a8 + 8)) {
          operator_delete(local_1b0,local_1a8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (ulong)(local_a8.field_2._M_allocated_capacity + 1));
        }
        std::vector<double,_std::allocator<double>_>::resize
                  (&local_288,(long)(local_250._24_8_ - local_250._16_8_) >> 5);
        pdVar3 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_250._24_8_ - local_250._16_8_ != 0) {
          lVar21 = (long)(local_250._24_8_ - local_250._16_8_) >> 5;
          lVar22 = 0;
          pSVar19 = (pointer)local_250._16_8_;
          do {
            dVar2 = atof((char *)(pSVar19->super_NamedVar).super_Variable._vptr_Variable);
            *(double *)((_Rb_tree_color *)pdVar3 + lVar22 * 2) = dVar2;
            lVar22 = lVar22 + 1;
            pSVar19 = (pointer)&(pSVar19->super_NamedVar).super_Variable.index_;
          } while (lVar21 + (ulong)(lVar21 == 0) != lVar22);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_250 + 0x10));
        pTVar8 = (TiXmlElement *)local_2b8._32_8_;
        this_00 = local_270;
      }
    }
    iVar6 = (*(this_00->super_CPT).super_Function._vptr_Function[2])(this_00,&local_48,&local_288);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"In <StateTransitionFunction>: Value assignment failed.","");
    pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Instance");
    Ensure(local_290,SUB41(iVar6,0),&local_190,(TiXmlBase *)pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    pTVar8 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar8->super_TiXmlNode);
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    if ((_Base_ptr)
        local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
      operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  } while( true );
}

Assistant:

TabularCPT* Parser::CreateTabularStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else if (table == "identity") { // keyword identity
			//EnsureIdentityIsValid(); // TODO
			for (int i = 0; i < child->Size(); i++) {
				for (int j = 0; j < child->Size(); j++) {
					values.push_back(i == j);
				}
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <StateTransitionFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}